

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O0

config * newconfig(void)

{
  config *pcVar1;
  int local_14;
  int amt;
  int i;
  config *newcfg;
  
  if (freelist == (config *)0x0) {
    freelist = (config *)calloc(3,0x48);
    if (freelist == (config *)0x0) {
      fprintf(_stderr,"Unable to allocate memory for a new configuration.");
      exit(1);
    }
    for (local_14 = 0; local_14 < 2; local_14 = local_14 + 1) {
      freelist[local_14].next = freelist + (local_14 + 1);
    }
    freelist[2].next = (config *)0x0;
  }
  pcVar1 = freelist;
  freelist = freelist->next;
  return pcVar1;
}

Assistant:

config *newconfig(){
  struct config *newcfg;
  if( freelist==0 ){
    int i;
    int amt = 3;
    freelist = (struct config *)calloc( amt, sizeof(struct config) );
    if( freelist==0 ){
      fprintf(stderr,"Unable to allocate memory for a new configuration.");
      exit(1);
    }
    for(i=0; i<amt-1; i++) freelist[i].next = &freelist[i+1];
    freelist[amt-1].next = 0;
  }
  newcfg = freelist;
  freelist = freelist->next;
  return newcfg;
}